

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowcontainer.cpp
# Opt level: O0

void __thiscall QWindowContainerPrivate::markParentChain(QWindowContainerPrivate *this)

{
  QWidgetPrivate *this_00;
  pointer pQVar1;
  QWindowContainerPrivate *in_RDI;
  QWidgetPrivate *d;
  QWidget *p;
  QWindowContainer *q;
  QWidget *local_18;
  
  local_18 = &q_func(in_RDI)->super_QWidget;
  while (local_18 != (QWidget *)0x0) {
    this_00 = QWidgetPrivate::get((QWidget *)0x3bbc28);
    QWidgetPrivate::createExtra(this_00);
    pQVar1 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                       ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x3bbc45);
    *(ushort *)&pQVar1->field_0x7c = *(ushort *)&pQVar1->field_0x7c & 0xfeff | 0x100;
    local_18 = QWidget::parentWidget((QWidget *)0x3bbc61);
  }
  return;
}

Assistant:

void markParentChain() {
        Q_Q(QWindowContainer);
        QWidget *p = q;
        while (p) {
            QWidgetPrivate *d = static_cast<QWidgetPrivate *>(QWidgetPrivate::get(p));
            d->createExtra();
            d->extra->hasWindowContainer = true;
            p = p->parentWidget();
        }
    }